

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O2

void __thiscall QStackedLayout::minimumSize(QStackedLayout *this)

{
  minimumSize((QStackedLayout *)&this[-1].super_QLayout.super_QLayoutItem);
  return;
}

Assistant:

QSize QStackedLayout::minimumSize() const
{
    Q_D(const QStackedLayout);
    QSize s(0, 0);
    int n = d->list.size();

    for (int i = 0; i < n; ++i)
        if (QWidget *widget = d->list.at(i)->widget())
            s = s.expandedTo(qSmartMinSize(widget));
    return s;
}